

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

void ipc_ep_cancel(nni_aio *aio,void *arg,int rv)

{
  nni_mtx_lock((nni_mtx *)arg);
  if (*(nni_aio **)((long)arg + 0x58) == aio) {
    *(undefined8 *)((long)arg + 0x58) = 0;
    nni_aio_finish_error(aio,rv);
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
ipc_ep_cancel(nni_aio *aio, void *arg, int rv)
{
	ipc_ep *ep = arg;
	nni_mtx_lock(&ep->mtx);
	if (aio == ep->user_aio) {
		ep->user_aio = NULL;
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&ep->mtx);
}